

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void action_papers(tgestate_t *state)

{
  mappos8_t *mappos;
  long in_RDI;
  uint8_t coord;
  uint8_t *pcoord;
  uint16_t range;
  undefined6 in_stack_fffffffffffffff0;
  undefined2 uVar1;
  
  if ((0x68 < *(byte *)(in_RDI + 0x68e)) && (*(byte *)(in_RDI + 0x68e) < 0x6d)) {
    uVar1 = 0x494b;
    mappos = (mappos8_t *)(in_RDI + 0x690);
    if ((0x48 < *(byte *)(in_RDI + 0x68f)) && (*(byte *)(in_RDI + 0x68f) < 0x4b)) {
      if (*(long *)(in_RDI + 1000) == 0x1239c0) {
        increase_morale_by_10_score_by_50((tgestate_t *)0x10844a);
        *(undefined1 *)(in_RDI + 0x3fc) = 0;
        *(long *)(in_RDI + 0x108) = in_RDI + 0x3c0;
        transition((tgestate_t *)CONCAT26(uVar1,in_stack_fffffffffffffff0),mappos);
      }
      else {
        solitary((tgestate_t *)pcoord);
      }
    }
  }
  return;
}

Assistant:

void action_papers(tgestate_t *state)
{
  /**
   * $EFF9: Position outside the main gate.
   */
  static const mappos8_t outside_main_gate = { 214, 138, 6 };

  uint16_t  range;  /* was DE */
  uint8_t  *pcoord; /* was HL */
  uint8_t   coord;  /* was A */

  assert(state != NULL);

  /* Is the hero within the main gate bounds? */
  // UNROLLED
  /* Range checking. X in (105..109) and Y in (73..75). */
  range = map_MAIN_GATE_X; // note the confused coords business
  pcoord = &state->hero_mappos.u;
  coord = *pcoord++;
  if (coord < ((range >> 8) & 0xFF) || coord >= ((range >> 0) & 0xFF))
    return;

  range = map_MAIN_GATE_Y;
  coord = *pcoord++; // -> state->hero_map_position.y
  if (coord < ((range >> 8) & 0xFF) || coord >= ((range >> 0) & 0xFF))
    return;

  /* Using the papers at the main gate when not in uniform causes the hero
   * to be sent to solitary */
  if (state->vischars[0].mi.sprite != &sprites[sprite_GUARD_FACING_AWAY_1])
  {
    solitary(state);
    return;
  }

  increase_morale_by_10_score_by_50(state);
  state->vischars[0].room = room_0_OUTDOORS;

  /* Transition to outside the main gate. */
  state->IY = &state->vischars[0];
  transition(state, &outside_main_gate);
  NEVER_RETURNS;
}